

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

void __thiscall libtorrent::aux::session_impl::update_listen_interfaces(session_impl *this)

{
  alert_manager *this_00;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *this_01;
  pointer pcVar1;
  pointer plVar2;
  pointer plVar3;
  session_impl *this_02;
  undefined8 uVar4;
  string *psVar5;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  undefined8 args;
  string net_interfaces;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  err;
  socket_type_t local_b6;
  operation_t local_b5;
  error_code_enum local_b4;
  session_impl *local_b0;
  string local_a8;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  local_48;
  
  psVar5 = session_settings::get_str_abi_cxx11_(&this->m_settings,5);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + psVar5->_M_string_length);
  local_68._M_allocated_capacity = 0;
  local_68._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_58 = 0;
  parse_listen_interfaces
            (&local_48,&local_a8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_68._M_local_buf);
  local_88._0_8_ =
       (this->m_listen_interfaces).
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (this->m_listen_interfaces).
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78._M_allocated_capacity =
       (size_type)
       (this->m_listen_interfaces).
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_listen_interfaces).
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = this;
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::~vector((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             *)local_88);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::~vector((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             *)&local_48);
  uVar4 = local_68._8_8_;
  if (local_68._M_allocated_capacity != local_68._8_8_) {
    this_00 = &local_b0->m_alerts;
    args = local_68._M_allocated_capacity;
    do {
      local_78._M_allocated_capacity = 0;
      local_78._8_8_ = 0;
      local_88._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_48.
      super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)local_48.
                            super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                            ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      local_b5 = parse_address;
      local_b4 = invalid_port;
      local_b6 = tcp;
      alert_manager::
      emplace_alert<libtorrent::listen_failed_alert,std::__cxx11::string_const&,boost::asio::ip::address,int,libtorrent::operation_t,libtorrent::errors::error_code_enum,libtorrent::socket_type_t>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
                 (address *)local_88,(int *)&local_48,&local_b5,&local_b4,&local_b6);
      args = args + 0x20;
    } while (args != uVar4);
  }
  this_02 = local_b0;
  if (((local_b0->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    this_01 = &local_b0->m_listen_interfaces;
    session_log(local_b0,"update listen interfaces: %s",local_a8._M_dataplus._M_p);
    plVar2 = (this_02->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar3 = (this_02->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    print_listen_interfaces_abi_cxx11_((string *)local_88,(aux *)this_01,in);
    session_log(this_02,"parsed listen interfaces count: %d, ifaces: %s",
                (ulong)(uint)((int)((ulong)((long)plVar3 - (long)plVar2) >> 3) * -0x33333333),
                local_88._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,(ulong)(local_78._M_allocated_capacity + 1));
    }
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void session_impl::update_listen_interfaces()
	{
		INVARIANT_CHECK;

		std::string const net_interfaces = m_settings.get_str(settings_pack::listen_interfaces);
		std::vector<std::string> err;
		m_listen_interfaces = parse_listen_interfaces(net_interfaces, err);

		for (auto const& e : err)
		{
			m_alerts.emplace_alert<listen_failed_alert>(e, lt::address{}, 0
				, operation_t::parse_address, errors::invalid_port, lt::socket_type_t::tcp);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("update listen interfaces: %s", net_interfaces.c_str());
			session_log("parsed listen interfaces count: %d, ifaces: %s"
				, int(m_listen_interfaces.size())
				, print_listen_interfaces(m_listen_interfaces).c_str());
		}
#endif
	}